

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,kj::String&,char_const*,kj::StringTree,char_const*,kj::StringPtr&,char_const(&)[11],kj::StringPtr&,char_const(&)[56],kj::StringTree,char_const(&)[9],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[14],bool&,char_const(&)[7]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,String *params_1,
          char **params_2,StringTree *params_3,char **params_4,StringPtr *params_5,
          char (*params_6) [11],StringPtr *params_7,char (*params_8) [56],StringTree *params_9,
          char (*params_10) [9],CappedArray<char,_17UL> *params_11,char (*params_12) [6],
          unsigned_short *params_13,char (*params_14) [14],bool *params_15,char (*params_16) [7])

{
  StringTree *pSVar1;
  String *value;
  char **ppcVar2;
  StringTree *pSVar3;
  StringPtr *pSVar4;
  char (*value_00) [11];
  char (*value_01) [56];
  StringTree *pSVar5;
  char (*value_02) [9];
  CappedArray<char,_17UL> *value_03;
  char (*value_04) [6];
  unsigned_short *value_05;
  char (*value_06) [14];
  bool *value_07;
  char (*value_08) [7];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_140;
  ArrayPtr<const_char> local_130;
  CappedArray<char,_8UL> local_120;
  CappedArray<char,_8UL> local_110;
  ArrayPtr<const_char> local_100;
  ArrayPtr<const_char> local_f0;
  ArrayPtr<const_char> local_e0;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  StringTree *local_60;
  char **params_local_4;
  StringTree *params_local_3;
  char **params_local_2;
  String *params_local_1;
  StringTree *params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = (char **)params;
  params_local_1 = (String *)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = fwd<kj::String&>((String *)params_local_2);
  local_70 = _::toStringTreeOrCharSequence<kj::String&>(value);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_3);
  local_80 = _::toStringTreeOrCharSequence<char_const*>(ppcVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  pSVar3 = _::toStringTreeOrCharSequence(pSVar3);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)local_60);
  local_90 = _::toStringTreeOrCharSequence<char_const*>(ppcVar2);
  pSVar4 = fwd<kj::StringPtr&>((StringPtr *)params_4);
  local_a0 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar4);
  value_00 = ::const((char (*) [11])params_5);
  local_b0 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value_00);
  pSVar4 = fwd<kj::StringPtr&>((StringPtr *)params_6);
  local_c0 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar4);
  value_01 = ::const((char (*) [56])params_7);
  local_d0 = _::toStringTreeOrCharSequence<char_const(&)[56]>(value_01);
  pSVar5 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_8);
  pSVar5 = _::toStringTreeOrCharSequence(pSVar5);
  value_02 = ::const((char (*) [9])params_9);
  local_e0 = _::toStringTreeOrCharSequence<char_const(&)[9]>(value_02);
  value_03 = fwd<kj::CappedArray<char,17ul>&>((CappedArray<char,_17UL> *)params_10);
  local_f0 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>&>(value_03);
  value_04 = ::const((char (*) [6])params_11);
  local_100 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value_04);
  value_05 = fwd<unsigned_short&>((unsigned_short *)params_12);
  local_110 = _::toStringTreeOrCharSequence<unsigned_short&>(value_05);
  value_06 = ::const((char (*) [14])params_13);
  local_120 = (CappedArray<char,_8UL>)_::toStringTreeOrCharSequence<char_const(&)[14]>(value_06);
  value_07 = fwd<bool&>((bool *)params_14);
  local_130 = (ArrayPtr<const_char>)_::toStringTreeOrCharSequence<bool&>(value_07);
  value_08 = ::const((char (*) [7])params_15);
  local_140 = _::toStringTreeOrCharSequence<char_const(&)[7]>(value_08);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,pSVar1,(StringTree *)&local_70,&local_80,
             (ArrayPtr<const_char> *)pSVar3,(StringTree *)&local_90,&local_a0,&local_b0,&local_c0,
             &local_d0,(ArrayPtr<const_char> *)pSVar5,(StringTree *)&local_e0,&local_f0,&local_100,
             (ArrayPtr<const_char> *)&local_110,&local_120,&local_130,(StringPtr *)&local_140,
             (ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}